

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeArray(ExpressionContext *ctx,SynArray *syntax)

{
  TypeBase *type;
  TypeBase *pTVar1;
  TypeBase *pTVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  undefined4 uVar6;
  int iVar7;
  ExprBase *pEVar8;
  TypeUnsizedArray *type_00;
  ExprError *value;
  undefined4 extraout_var;
  TypeBase *pTVar9;
  undefined4 extraout_var_00;
  ExprBase *pEVar10;
  TypeArray *pTVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar12;
  TypeBase *pTVar13;
  SynBase *pSVar14;
  TypeBase *type_01;
  ulong uVar15;
  uint i;
  int iVar16;
  undefined1 auVar17 [16];
  IntrusiveList<ExprBase> values;
  SmallArray<ExprBase_*,_64U> raw;
  ExprError *node;
  
  pSVar14 = (syntax->values).head;
  if (pSVar14 == (SynBase *)0x0) {
    __assert_fail("syntax->values.head",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0xf28,"ExprBase *AnalyzeArray(ExpressionContext &, SynArray *)");
  }
  raw.allocator = ctx->allocator;
  raw.data = raw.little;
  raw.count = 0;
  raw.max = 0x40;
  type_00 = (TypeUnsizedArray *)0x0;
  do {
    pEVar8 = AnalyzeExpression(ctx,pSVar14);
    if (raw.count == 0) {
      uVar12 = 0;
    }
    else {
      pTVar9 = (*raw.data)->type;
      uVar12 = raw.count;
      if (((pTVar9 != (TypeBase *)0x0) && (pTVar9 != pEVar8->type)) && (pTVar9->typeID == 0x13)) {
        type_00 = ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)pTVar9[1]._vptr_TypeBase);
        uVar12 = raw.count;
      }
    }
    if (uVar12 == raw.max) {
      SmallArray<ExprBase_*,_64U>::grow(&raw,uVar12);
    }
    if (raw.data == (ExprBase **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<ExprBase *, 64>::push_back(const T &) [T = ExprBase *, N = 64]"
                   );
    }
    uVar15 = raw._8_8_ & 0xffffffff;
    uVar12 = raw.count + 1;
    raw.count = uVar12;
    raw.data[uVar15] = pEVar8;
    pSVar14 = pSVar14->next;
  } while (pSVar14 != (SynBase *)0x0);
  if (uVar12 == 0) {
    values.head = (ExprBase *)0x0;
    values.tail = (ExprBase *)0x0;
LAB_0016a416:
    type_01 = (TypeBase *)0x0;
  }
  else {
    if (((*raw.data)->type != (TypeBase *)0x0) && ((*raw.data)->type->typeID == 0)) {
      values.head = (ExprBase *)0x0;
      values.tail = (ExprBase *)0x0;
      uVar15 = 0;
      do {
        IntrusiveList<ExprBase>::push_back(&values,raw.data[uVar15]);
        uVar15 = uVar15 + 1;
      } while (uVar15 < (raw._8_8_ & 0xffffffff));
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_01,iVar7);
      pTVar11 = (TypeArray *)ExpressionContext::GetErrorType(ctx);
      goto LAB_0016a461;
    }
    values.head = (ExprBase *)0x0;
    values.tail = (ExprBase *)0x0;
    uVar15 = 0;
    pTVar9 = (TypeBase *)0x0;
    do {
      value = (ExprError *)raw.data[uVar15];
      if (type_00 != (TypeUnsizedArray *)0x0) {
        value = (ExprError *)
                CreateCast(ctx,(value->super_ExprBase).source,(ExprBase *)value,(TypeBase *)type_00,
                           false);
      }
      type = (value->super_ExprBase).type;
      type_01 = type;
      if ((pTVar9 != (TypeBase *)0x0) && (type_01 = pTVar9, pTVar9 != type)) {
        pTVar1 = ctx->typeChar;
        pTVar2 = ctx->typeInt;
        if ((pTVar2 == type || ctx->typeShort == type) || (pTVar1 == type || ctx->typeBool == type))
        {
          if ((ctx->typeFloat != pTVar9) && (ctx->typeDouble != pTVar9)) {
            pTVar13 = ctx->typeLong;
LAB_0016a212:
            if (ctx->typeBool != pTVar9) {
              iVar7 = (int)pTVar9;
              iVar16 = (int)((ulong)pTVar9 >> 0x20);
              auVar17._0_4_ =
                   -(uint)((int)((ulong)pTVar1 >> 0x20) == iVar16 && (int)pTVar1 == iVar7);
              auVar17._4_4_ =
                   -(uint)(*(int *)&ctx->typeShort == iVar7 &&
                          (int)((ulong)ctx->typeShort >> 0x20) == iVar16);
              auVar17._8_4_ =
                   -(uint)((int)((ulong)pTVar2 >> 0x20) == iVar16 && (int)pTVar2 == iVar7);
              auVar17._12_4_ =
                   -(uint)((int)pTVar13 == iVar7 && (int)((ulong)pTVar13 >> 0x20) == iVar16);
              uVar6 = movmskps((int)pTVar1,auVar17);
              if ((char)uVar6 == '\0') goto LAB_0016a266;
            }
            if (pTVar9->size <= type->size) goto LAB_0016a266;
          }
        }
        else {
          if (ctx->typeLong != type) {
LAB_0016a266:
            if ((ctx->typeDouble == type || ctx->typeFloat == type) &&
               (ctx->typeDouble == pTVar9 || ctx->typeFloat == pTVar9)) {
              if (type->size < pTVar9->size) goto LAB_0016a2a8;
LAB_0016a2c4:
              if (type->typeID == 0) goto LAB_0016a30b;
            }
            else if (type != (TypeBase *)0x0) goto LAB_0016a2c4;
            pcVar3 = (type->name).begin;
            pcVar4 = (pTVar9->name).begin;
            value = anon_unknown.dwarf_c3752::ReportExpected
                              (ctx,(value->super_ExprBase).source,type,
                               "ERROR: array element %d type \'%.*s\' doesn\'t match \'%.*s\'",
                               (ulong)((int)uVar15 + 1),
                               (ulong)(uint)(*(int *)&(type->name).end - (int)pcVar3),pcVar3,
                               (ulong)(uint)(*(int *)&(pTVar9->name).end - (int)pcVar4),pcVar4);
            goto LAB_0016a30b;
          }
          if ((ctx->typeFloat != pTVar9) && (pTVar13 = type, ctx->typeDouble != pTVar9))
          goto LAB_0016a212;
        }
LAB_0016a2a8:
        value = (ExprError *)
                CreateCast(ctx,(value->super_ExprBase).source,&value->super_ExprBase,pTVar9,false);
      }
LAB_0016a30b:
      pSVar14 = (value->super_ExprBase).source;
      if ((value->super_ExprBase).type == ctx->typeVoid) {
        anon_unknown.dwarf_c3752::Stop
                  (ctx,pSVar14,"ERROR: array cannot be constructed from void type elements");
      }
      bVar5 = AssertValueExpression(ctx,pSVar14,&value->super_ExprBase);
      node = value;
      if (!bVar5) {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        node = (ExprError *)CONCAT44(extraout_var,iVar7);
        pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        (node->super_ExprBase).typeID = 0;
        (node->super_ExprBase).source = &syntax->super_SynBase;
        (node->super_ExprBase).type = pTVar9;
        (node->super_ExprBase).next = (ExprBase *)0x0;
        (node->super_ExprBase).listed = false;
        (node->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprError_00240b28;
        (node->values).allocator = (Allocator *)0x0;
        (node->values).data = (node->values).little;
        (node->values).count = 1;
        (node->values).max = 4;
        (node->values).little[0] = &value->super_ExprBase;
      }
      IntrusiveList<ExprBase>::push_back(&values,&node->super_ExprBase);
      uVar15 = uVar15 + 1;
      pTVar9 = type_01;
    } while (uVar15 < (raw._8_8_ & 0xffffffff));
    if (((values.head != (ExprBase *)0x0) && ((values.head)->type != (TypeBase *)0x0)) &&
       ((values.head)->type->typeID == 0)) {
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_02,iVar7);
      pTVar11 = (TypeArray *)ExpressionContext::GetErrorType(ctx);
      goto LAB_0016a461;
    }
    if (type_01 == (TypeBase *)0x0) goto LAB_0016a416;
    if ((type_01->typeID == 0x18) && (*(char *)((long)&type_01[3]._vptr_TypeBase + 2) == '\x01')) {
      anon_unknown.dwarf_c3752::Stop
                (ctx,&syntax->super_SynBase,
                 "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
                 ,(ulong)(uint)(*(int *)&(type_01->name).end - (int)(type_01->name).begin));
    }
  }
  if (0xffff < type_01->size) {
    anon_unknown.dwarf_c3752::Stop
              (ctx,&syntax->super_SynBase,"ERROR: array element size cannot exceed 65535 bytes");
  }
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
  uVar15 = 0;
  pEVar10 = values.head;
  if (values.head != (ExprBase *)0x0) {
    do {
      uVar12 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar12;
      pEVar10 = pEVar10->next;
    } while (pEVar10 != (ExprBase *)0x0);
    uVar15 = (ulong)uVar12;
  }
  pTVar11 = ExpressionContext::GetArrayType(ctx,type_01,uVar15);
LAB_0016a461:
  pEVar8->typeID = 0xf;
  pEVar8->source = &syntax->super_SynBase;
  pEVar8->type = &pTVar11->super_TypeBase;
  pEVar8->next = (ExprBase *)0x0;
  pEVar8->listed = false;
  pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240c08;
  pEVar8[1]._vptr_ExprBase = (_func_int **)values.head;
  *(ExprBase **)&pEVar8[1].typeID = values.tail;
  SmallArray<ExprBase_*,_64U>::~SmallArray(&raw);
  return pEVar8;
}

Assistant:

ExprBase* AnalyzeArray(ExpressionContext &ctx, SynArray *syntax)
{
	assert(syntax->values.head);

	SmallArray<ExprBase*, 64> raw(ctx.allocator);

	TypeBase *nestedUnsizedType = NULL;

	for(SynBase *el = syntax->values.head; el; el = el->next)
	{
		ExprBase *value = AnalyzeExpression(ctx, el);

		if(!raw.empty() && raw[0]->type != value->type)
		{
			if(TypeArray *arrayType = getType<TypeArray>(raw[0]->type))
				nestedUnsizedType = ctx.GetUnsizedArrayType(arrayType->subType);
		}

		raw.push_back(value);
	}

	// First value type is required to complete array definition
	if(!raw.empty() && isType<TypeError>(raw[0]->type))
	{
		IntrusiveList<ExprBase> values;

		for(unsigned i = 0; i < raw.size(); i++)
			values.push_back(raw[i]);

		return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetErrorType(), values);
	}

	IntrusiveList<ExprBase> values;

	TypeBase *subType = NULL;

	for(unsigned i = 0; i < raw.size(); i++)
	{
		ExprBase *value = raw[i];

		if(nestedUnsizedType)
			value = CreateCast(ctx, value->source, value, nestedUnsizedType, false);

		if(subType == NULL)
		{
			subType = value->type;
		}
		else if(subType != value->type)
		{
			// Allow numeric promotion
			if(ctx.IsIntegerType(value->type) && ctx.IsFloatingPointType(subType))
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(ctx.IsIntegerType(value->type) && ctx.IsIntegerType(subType) && subType->size > value->type->size)
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(ctx.IsFloatingPointType(value->type) && ctx.IsFloatingPointType(subType) && subType->size > value->type->size)
				value = CreateCast(ctx, value->source, value, subType, false);
			else if(!isType<TypeError>(value->type))
				value = ReportExpected(ctx, value->source, value->type, "ERROR: array element %d type '%.*s' doesn't match '%.*s'", i + 1, FMT_ISTR(value->type->name), FMT_ISTR(subType->name));
		}

		if(value->type == ctx.typeVoid)
			Stop(ctx, value->source, "ERROR: array cannot be constructed from void type elements");

		if(!AssertValueExpression(ctx, value->source, value))
			value = new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), value);

		values.push_back(value);
	}

	if(!values.empty() && isType<TypeError>(values[0]->type))
		return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetErrorType(), values);

	if(TypeClass *typeClass = getType<TypeClass>(subType))
	{
		if(typeClass->hasFinalizer)
			Stop(ctx, syntax, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(subType->name));
	}

	if(subType->size >= 64 * 1024)
		Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

	return new (ctx.get<ExprArray>()) ExprArray(syntax, ctx.GetArrayType(subType, values.size()), values);
}